

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

void UpnpRemoveAllVirtualDirs(void)

{
  virtual_Dir_List *pvVar1;
  virtual_Dir_List *__ptr;
  
  __ptr = pVirtualDirList;
  if (UpnpSdkInit == 1) {
    while (__ptr != (virtualDirList *)0x0) {
      pvVar1 = __ptr->next;
      free(__ptr);
      __ptr = pvVar1;
    }
    pVirtualDirList = (virtualDirList *)0x0;
  }
  return;
}

Assistant:

void UpnpRemoveAllVirtualDirs(void)
{
	virtualDirList *pCur;
	virtualDirList *pNext;

	if (UpnpSdkInit != 1) {
		return;
	}

	pCur = pVirtualDirList;

	while (pCur != NULL) {
		pNext = pCur->next;
		free(pCur);

		pCur = pNext;
	}

	pVirtualDirList = NULL;
}